

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

Expr cons(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
         int argc)

{
  char *__s;
  Expr EVar1;
  Expr EVar2;
  Expr car;
  Expr cdr;
  
  if (argc == 2) {
    EVar1._4_4_ = 0;
    EVar1.type = args->type;
    EVar1.field_1.val_atom = (args->field_1).val_atom;
    EVar1 = exec_eval(exec,callContext,EVar1);
    car.field_1 = EVar1.field_1;
    EVar2._4_4_ = 0;
    EVar2.type = args[1].type;
    EVar2.field_1.val_atom = args[1].field_1.val_atom;
    EVar2 = exec_eval(exec,callContext,EVar2);
    car._4_4_ = 0;
    car.type = EVar1.type;
    cdr._4_4_ = 0;
    cdr.type = EVar2.type;
    cdr.field_1.val_atom = EVar2.field_1.val_atom;
    EVar1 = make_pair(exec,car,cdr);
    if (EVar1.type != VT_NONE) {
      return EVar1;
    }
    __s = "cons: make_pair failed";
  }
  else {
    __s = "cons: expected two arguments";
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(cons)
{
    if (argc != 2)
    {
        log("cons: expected two arguments");
        exit(1);
    }
    Expr car = exec_eval(exec, callContext, args[0]);
    Expr cdr = exec_eval(exec, callContext, args[1]);
    Expr pair = make_pair(exec, car, cdr);
    if (pair.type == VT_NONE)
    {
        log("cons: make_pair failed");
        exit(1);
    }
    return pair;
}